

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sample02.cpp
# Opt level: O2

long __thiscall Dog::go_abi_cxx11_(Dog *this)

{
  int in_EDX;
  int iVar1;
  
  (this->super_Animal)._vptr_Animal = (_func_int **)(this + 2);
  this[1].super_Animal._vptr_Animal = (_func_int **)0x0;
  *(undefined1 *)&this[2].super_Animal._vptr_Animal = 0;
  iVar1 = 0;
  if (0 < in_EDX) {
    iVar1 = in_EDX;
  }
  while (iVar1 != 0) {
    std::__cxx11::string::append((char *)this);
    iVar1 = iVar1 + -1;
  }
  return (long)this;
}

Assistant:

std::string go(int n_times) override {
		std::string result;
		for (int i = 0; i < n_times; i++) {
			result += u8"ワン! ";
		}
		return result;
	}